

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O1

bool __thiscall
google::protobuf::compiler::CommandLineInterface::EnforceEditionsSupport
          (CommandLineInterface *this,string *codegen_name,uint64_t supported_features,
          Edition minimum_edition,Edition maximum_edition,
          vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
          *parsed_files)

{
  FileDescriptor *this_00;
  size_type sVar1;
  size_type sVar2;
  size_type sVar3;
  bool bVar4;
  Edition edition;
  char *extraout_RDX;
  pointer ppFVar5;
  undefined8 uVar6;
  _Alloc_hider _Var7;
  int iVar8;
  bool bVar9;
  string_view filename;
  string_view format;
  string_view format_00;
  string_view format_01;
  string result;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_108;
  long local_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  StringifySink local_e8;
  StringifySink local_c8;
  Edition local_a8;
  Edition local_a4;
  pointer local_a0;
  pointer local_98;
  string *local_90;
  size_type local_88;
  pointer local_80;
  size_type local_78;
  pointer local_70;
  size_type local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_60;
  size_type local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_50;
  uint64_t local_40;
  pointer local_38;
  
  bVar9 = true;
  if (this->experimental_editions_ == false) {
    ppFVar5 = (parsed_files->
              super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
              )._M_impl.super__Vector_impl_data._M_start;
    local_38 = (parsed_files->
               super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
               )._M_impl.super__Vector_impl_data._M_finish;
    bVar9 = ppFVar5 == local_38;
    local_90 = codegen_name;
    local_40 = supported_features;
    local_a4 = minimum_edition;
    local_a8 = maximum_edition;
    while (!bVar9) {
      this_00 = *ppFVar5;
      edition = FileDescriptor::edition(this_00);
      iVar8 = 3;
      if ((999 < (int)edition) &&
         (filename._M_str = extraout_RDX,
         filename._M_len = (size_t)(this_00->name_->_M_dataplus)._M_p,
         bVar4 = CanSkipEditionCheck((compiler *)this_00->name_->_M_string_length,filename), !bVar4)
         ) {
        if ((local_40 & 2) == 0) {
          local_80 = (this_00->name_->_M_dataplus)._M_p;
          local_88 = this_00->name_->_M_string_length;
          local_70 = (local_90->_M_dataplus)._M_p;
          local_78 = local_90->_M_string_length;
          local_100 = 0;
          local_f8._M_local_buf[0] = '\0';
          format._M_str = (char *)&local_88;
          format._M_len =
               (size_t)
               "$0: is an editions file, but code generator $1 hasn\'t been updated to support editions yet.  Please ask the owner of this code generator to add support or switch back to proto2/proto3.\n\nSee https://protobuf.dev/editions/overview/ for more information."
          ;
          local_108 = &local_f8;
          absl::lts_20250127::substitute_internal::SubstituteAndAppendArray
                    ((substitute_internal *)&local_108,(Nonnull<std::string_*>)0xfb,format,
                     (Nullable<const_absl::string_view_*>)0x2,(size_t)parsed_files);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,local_108->_M_local_buf,local_100);
          if (local_108 != &local_f8) {
            uVar6 = CONCAT71(local_f8._M_allocated_capacity._1_7_,local_f8._M_local_buf[0]);
            _Var7._M_p = (pointer)local_108;
LAB_001da577:
            operator_delete(_Var7._M_p,uVar6 + 1);
          }
        }
        else {
          if ((int)edition < (int)local_a4) {
            local_98 = (this_00->name_->_M_dataplus)._M_p;
            sVar1 = this_00->name_->_M_string_length;
            local_a0 = (local_90->_M_dataplus)._M_p;
            sVar2 = local_90->_M_string_length;
            local_c8.buffer_.field_2._8_8_ = 0;
            local_c8.buffer_._M_dataplus._M_p = (pointer)&local_c8.buffer_.field_2;
            local_c8.buffer_._M_string_length = 0;
            local_c8.buffer_.field_2._M_allocated_capacity = 0;
            AbslStringify<absl::lts_20250127::strings_internal::StringifySink>(&local_c8,edition);
            sVar3 = local_c8.buffer_._M_string_length;
            _Var7._M_p = local_c8.buffer_._M_dataplus._M_p;
            local_e8.buffer_.field_2._8_8_ = 0;
            local_e8.buffer_._M_dataplus._M_p = (pointer)&local_e8.buffer_.field_2;
            local_e8.buffer_._M_string_length = 0;
            local_e8.buffer_.field_2._M_allocated_capacity = 0;
            AbslStringify<absl::lts_20250127::strings_internal::StringifySink>(&local_e8,local_a4);
            local_108 = &local_f8;
            local_100 = 0;
            local_f8._M_local_buf[0] = '\0';
            local_80 = local_98;
            local_70 = local_a0;
            local_68 = sVar3;
            local_60 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)_Var7._M_p;
            local_58 = local_e8.buffer_._M_string_length;
            local_50 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)local_e8.buffer_._M_dataplus._M_p;
            format_00._M_str = (char *)&local_88;
            format_00._M_len =
                 (size_t)
                 "$0: is a file using edition $2, which isn\'t supported by code generator $1.  Please upgrade your file to at least edition $3."
            ;
            local_88 = sVar1;
            local_78 = sVar2;
            absl::lts_20250127::substitute_internal::SubstituteAndAppendArray
                      ((substitute_internal *)&local_108,(Nonnull<std::string_*>)0x7d,format_00,
                       (Nullable<const_absl::string_view_*>)0x4,(size_t)parsed_files);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,local_108->_M_local_buf,local_100);
          }
          else {
            iVar8 = 0;
            if ((int)edition <= (int)local_a8) goto LAB_001da585;
            local_98 = (this_00->name_->_M_dataplus)._M_p;
            sVar1 = this_00->name_->_M_string_length;
            local_a0 = (local_90->_M_dataplus)._M_p;
            sVar2 = local_90->_M_string_length;
            local_c8.buffer_.field_2._8_8_ = 0;
            local_c8.buffer_._M_dataplus._M_p = (pointer)&local_c8.buffer_.field_2;
            local_c8.buffer_._M_string_length = 0;
            local_c8.buffer_.field_2._M_allocated_capacity = 0;
            AbslStringify<absl::lts_20250127::strings_internal::StringifySink>(&local_c8,edition);
            sVar3 = local_c8.buffer_._M_string_length;
            _Var7._M_p = local_c8.buffer_._M_dataplus._M_p;
            local_e8.buffer_.field_2._8_8_ = 0;
            local_e8.buffer_._M_dataplus._M_p = (pointer)&local_e8.buffer_.field_2;
            local_e8.buffer_._M_string_length = 0;
            local_e8.buffer_.field_2._M_allocated_capacity = 0;
            AbslStringify<absl::lts_20250127::strings_internal::StringifySink>(&local_e8,local_a8);
            local_108 = &local_f8;
            local_100 = 0;
            local_f8._M_local_buf[0] = '\0';
            local_80 = local_98;
            local_70 = local_a0;
            local_68 = sVar3;
            local_60 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)_Var7._M_p;
            local_58 = local_e8.buffer_._M_string_length;
            local_50 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)local_e8.buffer_._M_dataplus._M_p;
            format_01._M_str = (char *)&local_88;
            format_01._M_len =
                 (size_t)
                 "$0: is a file using edition $2, which isn\'t supported by code generator $1.  Please ask the owner of this code generator to add support or switch back to a maximum of edition $3."
            ;
            local_88 = sVar1;
            local_78 = sVar2;
            absl::lts_20250127::substitute_internal::SubstituteAndAppendArray
                      ((substitute_internal *)&local_108,(Nonnull<std::string_*>)0xb2,format_01,
                       (Nullable<const_absl::string_view_*>)0x4,(size_t)parsed_files);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,local_108->_M_local_buf,local_100);
          }
          if (local_108 != &local_f8) {
            operator_delete(local_108,
                            CONCAT71(local_f8._M_allocated_capacity._1_7_,local_f8._M_local_buf[0])
                            + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e8.buffer_._M_dataplus._M_p != &local_e8.buffer_.field_2) {
            operator_delete(local_e8.buffer_._M_dataplus._M_p,
                            local_e8.buffer_.field_2._M_allocated_capacity + 1);
          }
          uVar6 = local_c8.buffer_.field_2._M_allocated_capacity;
          _Var7._M_p = local_c8.buffer_._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c8.buffer_._M_dataplus._M_p != &local_c8.buffer_.field_2) goto LAB_001da577;
        }
        iVar8 = 1;
      }
LAB_001da585:
      if ((iVar8 != 3) && (iVar8 != 0)) {
        return bVar9;
      }
      ppFVar5 = ppFVar5 + 1;
      bVar9 = ppFVar5 == local_38;
    }
  }
  return bVar9;
}

Assistant:

bool CommandLineInterface::EnforceEditionsSupport(
    const std::string& codegen_name, uint64_t supported_features,
    Edition minimum_edition, Edition maximum_edition,
    const std::vector<const FileDescriptor*>& parsed_files) const {
  if (experimental_editions_) {
    // The user has explicitly specified the experimental flag.
    return true;
  }
  for (const auto* fd : parsed_files) {
    Edition edition =
        ::google::protobuf::internal::InternalFeatureHelper::GetEdition(*fd);
    if (edition < Edition::EDITION_2023 || CanSkipEditionCheck(fd->name())) {
      // Legacy proto2/proto3 or exempted files don't need any checks.
      continue;
    }

    if ((supported_features & CodeGenerator::FEATURE_SUPPORTS_EDITIONS) == 0) {
      std::cerr << absl::Substitute(
          "$0: is an editions file, but code generator $1 hasn't been "
          "updated to support editions yet.  Please ask the owner of this code "
          "generator to add support or switch back to proto2/proto3.\n\nSee "
          "https://protobuf.dev/editions/overview/ for more information.",
          fd->name(), codegen_name);
      return false;
    }
    if (edition < minimum_edition) {
      std::cerr << absl::Substitute(
          "$0: is a file using edition $2, which isn't supported by code "
          "generator $1.  Please upgrade your file to at least edition $3.",
          fd->name(), codegen_name, edition, minimum_edition);
      return false;
    }
    if (edition > maximum_edition) {
      std::cerr << absl::Substitute(
          "$0: is a file using edition $2, which isn't supported by code "
          "generator $1.  Please ask the owner of this code generator to add "
          "support or switch back to a maximum of edition $3.",
          fd->name(), codegen_name, edition, maximum_edition);
      return false;
    }
  }
  return true;
}